

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

cio_error cio_http_server_serve(cio_http_server *server)

{
  cio_error local_1c;
  cio_error err;
  cio_http_server *server_local;
  
  local_1c = cio_server_socket_set_reuse_address(&server->server_socket,true);
  if (((local_1c != CIO_SUCCESS) ||
      (local_1c = cio_server_socket_bind(&server->server_socket,&server->endpoint),
      local_1c != CIO_SUCCESS)) ||
     (local_1c = cio_server_socket_accept(&server->server_socket,handle_accept,server),
     server_local._4_4_ = local_1c, local_1c != CIO_SUCCESS)) {
    cio_server_socket_close(&server->server_socket);
    server_local._4_4_ = local_1c;
  }
  return server_local._4_4_;
}

Assistant:

enum cio_error cio_http_server_serve(struct cio_http_server *server)
{
	enum cio_error err = cio_server_socket_set_reuse_address(&server->server_socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto close_socket;
	}

	err = cio_server_socket_bind(&server->server_socket, &server->endpoint);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto close_socket;
	}

	err = cio_server_socket_accept(&server->server_socket, handle_accept, server);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto close_socket;
	}

	return err;

close_socket:
	cio_server_socket_close(&server->server_socket);
	return err;
}